

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O2

void __thiscall
CountAggregate::CountAggregate
          (CountAggregate *this,string *pathToFiles,shared_ptr<Launcher> *launcher)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountAggregate_00152bb0;
  std::__cxx11::string::string((string *)&this->_pathToFiles,(string *)pathToFiles);
  std::__shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>,
             &launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>);
  (this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this->_features = (int **)0x0;
  (this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_fadeAggregates).determinantValueSet =
       (set<double,_std::less<double>,_std::allocator<double>_> *)0x0;
  this->_cofactorMatrix = (ResultType *)0x0;
  (this->_fadeAggregates).categoricalAggregates.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fadeAggregates).functionalDependencies =
       (map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
        *)0x0;
  (this->_fadeAggregates).categoricalAggregates.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fadeAggregates).categoricalAggregates.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fadeAggregates).aggregates = (DataType *)0x0;
  (this->_fadeAggregates).categoricalOffsets = (int *)0x0;
  (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_aggregateRegister).
  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_aggregateRegister).
  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_aggregateRegister).
  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_lineageRegister).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_lineageRegister).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_lineageRegister).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->onehotfeatures = (bool *)0x0;
  this->isDetermined = (bool *)0x0;
  this->determinedBy = (int *)0x0;
  Launcher::getDTree((Launcher *)&local_80);
  std::__shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
  lVar1 = std::chrono::_V2::system_clock::now();
  createAggregateRegister(this);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::__cxx11::to_string(&local_60,lVar1 / -1000000 + lVar2 / 1000000);
  std::operator+(&local_40,"TIME - Count precomputation: ",&local_60);
  std::operator+(&local_80,&local_40,"ms.\n");
  std::operator<<((ostream *)&std::cout,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

CountAggregate::CountAggregate(
    const string& pathToFiles, shared_ptr<Launcher> launcher) :
    _pathToFiles(pathToFiles), _launcher(launcher)
{
    _dTree = launcher->getDTree();

#ifdef BENCH
    int64_t startPrecompute = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    /* creates the aggregate Register that is passed to FADE. */
    createAggregateRegister();
    
#ifdef BENCH
    int64_t endPrecompute = duration_cast<milliseconds>
        (system_clock::now().time_since_epoch()).count() - startPrecompute;    
#endif
    
    BINFO( "TIME - Count precomputation: "
           + to_string(endPrecompute) + "ms.\n");
}